

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_defs.hpp
# Opt level: O0

bool __thiscall
iutest::floating_point<long_double>::NanSensitiveAlmostNear
          (floating_point<long_double> *this,_Myt *rhs,longdouble max_abs_error)

{
  bool bVar1;
  longdouble max_abs_error_local;
  _Myt *rhs_local;
  floating_point<long_double> *this_local;
  
  bVar1 = is_nan(this);
  if ((bVar1) && (bVar1 = is_nan(rhs), bVar1)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = AlmostNear(this,rhs,max_abs_error);
  }
  return this_local._7_1_;
}

Assistant:

bool    NanSensitiveAlmostNear(const _Myt& rhs, RawType max_abs_error) const
    {
        if( is_nan() && rhs.is_nan() )
        {
            return true;
        }
        return AlmostNear(rhs, max_abs_error);
    }